

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<std::pair<QTableWidgetItem_*,_int>_>::reserve
          (QList<std::pair<QTableWidgetItem_*,_int>_> *this,qsizetype asize)

{
  bool bVar1;
  Int IVar2;
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *pQVar3;
  qsizetype qVar4;
  pair<QTableWidgetItem_*,_int> *b;
  Data *pDVar5;
  long in_RSI;
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *in_stack_ffffffffffffff80;
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QPodArrayOps<std::pair<QTableWidgetItem_*,_int>_> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *)
           capacity((QList<std::pair<QTableWidgetItem_*,_int>_> *)0x8df34f);
  qVar4 = QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::freeSpaceAtBegin
                    (in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)pQVar3 - qVar4) {
    QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar2 != 0) goto LAB_008df4f2;
    QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::isShared
                      (in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::setFlag
                ((QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *)0x8df3f6,
                 (ArrayOptions)f.i);
      goto LAB_008df4f2;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (pair<QTableWidgetItem_*,_int> *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<std::pair<QTableWidgetItem_*,_int>_> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::QArrayDataPointer
            (pQVar3,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  pQVar3 = (QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *)
           QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::operator->(&local_38);
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::operator->(in_RDI);
  b = QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::begin
                ((QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *)0x8df476);
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::operator->(in_RDI);
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::end(pQVar3);
  QtPrivate::QPodArrayOps<std::pair<QTableWidgetItem_*,_int>_>::copyAppend
            (in_stack_ffffffffffffff90,b,(pair<QTableWidgetItem_*,_int> *)pQVar3);
  pDVar5 = QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::d_ptr(&local_38);
  if (pDVar5 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *)
         QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)pQVar3,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::setFlag
              ((QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *)0x8df4d9,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::swap(pQVar3,in_stack_ffffffffffffff78);
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::~QArrayDataPointer(pQVar3);
LAB_008df4f2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}